

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

MovePtr<vkt::memory::(anonymous_namespace)::RenderPassCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>_>
* vkt::memory::anon_unknown_0::createRenderPassCommand
            (MovePtr<vkt::memory::(anonymous_namespace)::RenderPassCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>_>
             *__return_storage_ptr__,Random *param_1,State *param_2,Op op)

{
  RenderVertexBuffer *this;
  RenderIndexBuffer *this_00;
  RenderVertexUniformBuffer *this_01;
  RenderFragmentUniformBuffer *this_02;
  RenderVertexUniformTexelBuffer *this_03;
  RenderFragmentUniformTexelBuffer *this_04;
  RenderVertexStorageBuffer *this_05;
  RenderFragmentStorageBuffer *this_06;
  RenderVertexStorageTexelBuffer *this_07;
  RenderFragmentStorageTexelBuffer *this_08;
  RenderVertexStorageImage *this_09;
  RenderFragmentStorageImage *this_10;
  RenderVertexSampledImage *this_11;
  RenderFragmentSampledImage *this_12;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand> local_43;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand> local_42;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand> local_41;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand> local_40;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand> local_3f;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand> local_3e;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand> local_3d;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand> local_3c;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand> local_3b;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand> local_3a;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand> local_39;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand> local_38;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand> local_37;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand> local_36;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand> local_35 [17];
  Op local_24;
  State *pSStack_20;
  Op op_local;
  State *param_1_local;
  Random *param_0_local;
  
  local_24 = op;
  pSStack_20 = param_2;
  param_1_local = (State *)param_1;
  param_0_local = (Random *)__return_storage_ptr__;
  switch(op) {
  case OP_RENDER_VERTEX_BUFFER:
    this = (RenderVertexBuffer *)operator_new(0x70);
    RenderVertexBuffer::RenderVertexBuffer(this);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>::DefaultDeleter
              (local_35);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::RenderPassCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>_>
    ::MovePtr(__return_storage_ptr__,this);
    break;
  case OP_RENDER_INDEX_BUFFER:
    this_00 = (RenderIndexBuffer *)operator_new(0x70);
    RenderIndexBuffer::RenderIndexBuffer(this_00);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>::DefaultDeleter
              (&local_36);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::RenderPassCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>_>
    ::MovePtr(__return_storage_ptr__,this_00);
    break;
  case OP_RENDER_VERTEX_UNIFORM_BUFFER:
    this_01 = (RenderVertexUniformBuffer *)operator_new(0xa8);
    RenderVertexUniformBuffer::RenderVertexUniformBuffer(this_01);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>::DefaultDeleter
              (&local_37);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::RenderPassCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>_>
    ::MovePtr(__return_storage_ptr__,this_01);
    break;
  case OP_RENDER_FRAGMENT_UNIFORM_BUFFER:
    this_02 = (RenderFragmentUniformBuffer *)operator_new(0xb8);
    RenderFragmentUniformBuffer::RenderFragmentUniformBuffer(this_02);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>::DefaultDeleter
              (&local_38);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::RenderPassCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>_>
    ::MovePtr(__return_storage_ptr__,this_02);
    break;
  case OP_RENDER_VERTEX_UNIFORM_TEXEL_BUFFER:
    this_03 = (RenderVertexUniformTexelBuffer *)operator_new(0xd8);
    RenderVertexUniformTexelBuffer::RenderVertexUniformTexelBuffer(this_03);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>::DefaultDeleter
              (&local_39);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::RenderPassCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>_>
    ::MovePtr(__return_storage_ptr__,this_03);
    break;
  case OP_RENDER_FRAGMENT_UNIFORM_TEXEL_BUFFER:
    this_04 = (RenderFragmentUniformTexelBuffer *)operator_new(0xe8);
    RenderFragmentUniformTexelBuffer::RenderFragmentUniformTexelBuffer(this_04);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>::DefaultDeleter
              (&local_3a);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::RenderPassCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>_>
    ::MovePtr(__return_storage_ptr__,this_04);
    break;
  case OP_RENDER_VERTEX_STORAGE_BUFFER:
    this_05 = (RenderVertexStorageBuffer *)operator_new(0xa8);
    RenderVertexStorageBuffer::RenderVertexStorageBuffer(this_05);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>::DefaultDeleter
              (&local_3b);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::RenderPassCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>_>
    ::MovePtr(__return_storage_ptr__,this_05);
    break;
  case OP_RENDER_FRAGMENT_STORAGE_BUFFER:
    this_06 = (RenderFragmentStorageBuffer *)operator_new(0xc0);
    RenderFragmentStorageBuffer::RenderFragmentStorageBuffer(this_06);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>::DefaultDeleter
              (&local_3c);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::RenderPassCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>_>
    ::MovePtr(__return_storage_ptr__,this_06);
    break;
  case OP_RENDER_VERTEX_STORAGE_TEXEL_BUFFER:
    this_07 = (RenderVertexStorageTexelBuffer *)operator_new(0xd8);
    RenderVertexStorageTexelBuffer::RenderVertexStorageTexelBuffer(this_07);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>::DefaultDeleter
              (&local_3d);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::RenderPassCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>_>
    ::MovePtr(__return_storage_ptr__,this_07);
    break;
  case OP_RENDER_FRAGMENT_STORAGE_TEXEL_BUFFER:
    this_08 = (RenderFragmentStorageTexelBuffer *)operator_new(0xe8);
    RenderFragmentStorageTexelBuffer::RenderFragmentStorageTexelBuffer(this_08);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>::DefaultDeleter
              (&local_3e);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::RenderPassCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>_>
    ::MovePtr(__return_storage_ptr__,this_08);
    break;
  case OP_RENDER_VERTEX_STORAGE_IMAGE:
    this_09 = (RenderVertexStorageImage *)operator_new(200);
    RenderVertexStorageImage::RenderVertexStorageImage(this_09);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>::DefaultDeleter
              (&local_3f);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::RenderPassCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>_>
    ::MovePtr(__return_storage_ptr__,this_09);
    break;
  case OP_RENDER_FRAGMENT_STORAGE_IMAGE:
    this_10 = (RenderFragmentStorageImage *)operator_new(200);
    RenderFragmentStorageImage::RenderFragmentStorageImage(this_10);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>::DefaultDeleter
              (&local_40);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::RenderPassCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>_>
    ::MovePtr(__return_storage_ptr__,this_10);
    break;
  case OP_RENDER_VERTEX_SAMPLED_IMAGE:
    this_11 = (RenderVertexSampledImage *)operator_new(0xe8);
    RenderVertexSampledImage::RenderVertexSampledImage(this_11);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>::DefaultDeleter
              (&local_41);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::RenderPassCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>_>
    ::MovePtr(__return_storage_ptr__,this_11);
    break;
  case OP_RENDER_FRAGMENT_SAMPLED_IMAGE:
    this_12 = (RenderFragmentSampledImage *)operator_new(0xe8);
    RenderFragmentSampledImage::RenderFragmentSampledImage(this_12);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>::DefaultDeleter
              (&local_42);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::RenderPassCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>_>
    ::MovePtr(__return_storage_ptr__,this_12);
    break;
  default:
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>::DefaultDeleter
              (&local_43);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::RenderPassCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::RenderPassCommand>_>
    ::MovePtr(__return_storage_ptr__,0);
  }
  return __return_storage_ptr__;
}

Assistant:

de::MovePtr<RenderPassCommand> createRenderPassCommand (de::Random&,
														const State&,
														Op				op)
{
	switch (op)
	{
		case OP_RENDER_VERTEX_BUFFER:					return de::MovePtr<RenderPassCommand>(new RenderVertexBuffer());
		case OP_RENDER_INDEX_BUFFER:					return de::MovePtr<RenderPassCommand>(new RenderIndexBuffer());

		case OP_RENDER_VERTEX_UNIFORM_BUFFER:			return de::MovePtr<RenderPassCommand>(new RenderVertexUniformBuffer());
		case OP_RENDER_FRAGMENT_UNIFORM_BUFFER:			return de::MovePtr<RenderPassCommand>(new RenderFragmentUniformBuffer());

		case OP_RENDER_VERTEX_UNIFORM_TEXEL_BUFFER:		return de::MovePtr<RenderPassCommand>(new RenderVertexUniformTexelBuffer());
		case OP_RENDER_FRAGMENT_UNIFORM_TEXEL_BUFFER:	return de::MovePtr<RenderPassCommand>(new RenderFragmentUniformTexelBuffer());

		case OP_RENDER_VERTEX_STORAGE_BUFFER:			return de::MovePtr<RenderPassCommand>(new RenderVertexStorageBuffer());
		case OP_RENDER_FRAGMENT_STORAGE_BUFFER:			return de::MovePtr<RenderPassCommand>(new RenderFragmentStorageBuffer());

		case OP_RENDER_VERTEX_STORAGE_TEXEL_BUFFER:		return de::MovePtr<RenderPassCommand>(new RenderVertexStorageTexelBuffer());
		case OP_RENDER_FRAGMENT_STORAGE_TEXEL_BUFFER:	return de::MovePtr<RenderPassCommand>(new RenderFragmentStorageTexelBuffer());

		case OP_RENDER_VERTEX_STORAGE_IMAGE:			return de::MovePtr<RenderPassCommand>(new RenderVertexStorageImage());
		case OP_RENDER_FRAGMENT_STORAGE_IMAGE:			return de::MovePtr<RenderPassCommand>(new RenderFragmentStorageImage());

		case OP_RENDER_VERTEX_SAMPLED_IMAGE:			return de::MovePtr<RenderPassCommand>(new RenderVertexSampledImage());
		case OP_RENDER_FRAGMENT_SAMPLED_IMAGE:			return de::MovePtr<RenderPassCommand>(new RenderFragmentSampledImage());

		default:
			DE_FATAL("Unknown op");
			return de::MovePtr<RenderPassCommand>(DE_NULL);
	}
}